

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall MPLSStreamInfo::parseStreamAttributes(MPLSStreamInfo *this,BitStreamReader *reader)

{
  bool bVar1;
  StreamType stream_coding_type;
  uint uVar2;
  uint uStack_30;
  
  BitStreamReader::skipBits(reader,8);
  stream_coding_type = BitStreamReader::getBits(reader,8);
  (this->super_M2TSStreamInfo).stream_coding_type = stream_coding_type;
  bVar1 = isVideoStreamType(stream_coding_type);
  if (bVar1) {
    uVar2 = BitStreamReader::getBits(reader,4);
    (this->super_M2TSStreamInfo).video_format = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(reader,4);
    (this->super_M2TSStreamInfo).frame_rate_index = (uint8_t)uVar2;
    uStack_30 = 0x18;
LAB_001e9f0f:
    BitStreamReader::skipBits(reader,uStack_30);
    return;
  }
  bVar1 = isAudioStreamType(stream_coding_type);
  if (bVar1) {
    uVar2 = BitStreamReader::getBits(reader,4);
    (this->super_M2TSStreamInfo).audio_presentation_type = (uint8_t)uVar2;
    BitStreamReader::skipBits(reader,4);
  }
  else {
    if (stream_coding_type - SUB_PGS < 2) {
      CLPIStreamInfo::readString((this->super_M2TSStreamInfo).language_code,reader,3);
      uStack_30 = 8;
      goto LAB_001e9f0f;
    }
    if (stream_coding_type != SUB_TGS) {
      return;
    }
    uVar2 = BitStreamReader::getBits(reader,8);
    (this->super_M2TSStreamInfo).character_code = (uint8_t)uVar2;
  }
  CLPIStreamInfo::readString((this->super_M2TSStreamInfo).language_code,reader,3);
  return;
}

Assistant:

void MPLSStreamInfo::parseStreamAttributes(BitStreamReader& reader)
{
    reader.skipBits(8);  // length
    stream_coding_type = static_cast<StreamType>(reader.getBits(8));
    if (isVideoStreamType(stream_coding_type))
    {
        video_format = reader.getBits<uint8_t>(4);
        frame_rate_index = reader.getBits<uint8_t>(4);
        reader.skipBits(24);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        audio_presentation_type = reader.getBits<uint8_t>(4);
        reader.skipBits(4);  // sampling_frequency_index
        CLPIStreamInfo::readString(language_code, reader, 3);
    }
    else if (stream_coding_type == StreamType::SUB_PGS || stream_coding_type == StreamType::SUB_IGS)
    {
        CLPIStreamInfo::readString(language_code, reader, 3);
        reader.skipBits(8);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_TGS)
    {
        // Text subtitle stream
        character_code = reader.getBits<uint8_t>(8);
        CLPIStreamInfo::readString(language_code, reader, 3);
    }
}